

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.c
# Opt level: O1

void event_exit(int errcode)

{
  if (fatal_fn == (event_fatal_cb)0x0) {
    if (errcode == -0x21522153) {
      abort();
    }
  }
  else {
    (*fatal_fn)(errcode);
  }
  exit(errcode);
}

Assistant:

static void
event_exit(int errcode)
{
	if (fatal_fn) {
		fatal_fn(errcode);
		exit(errcode); /* should never be reached */
	} else if (errcode == EVENT_ERR_ABORT_)
		abort();
	else
		exit(errcode);
}